

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiramHdiv.cpp
# Opt level: O0

void pzshape::TPZShapePiramHdiv::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  TPZVec<int> *in_RDX;
  TPZVec<double> *in_RDI;
  double row;
  int d_1;
  int shape_1;
  int d;
  int shape;
  int nshape;
  int norig;
  int is;
  int countorig;
  int count;
  REAL zst;
  TPZFNMatrix<60,_double> dphicp;
  TPZFNMatrix<20,_double> phicp;
  REAL temp;
  TPZFMatrix<double> *in_stack_000012d0;
  TPZFMatrix<double> *in_stack_000012d8;
  TPZVec<int> *in_stack_000012e0;
  TPZVec<long> *in_stack_000012e8;
  TPZVec<double> *in_stack_000012f0;
  int in_stack_fffffffffffffb1c;
  undefined8 in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  double in_stack_fffffffffffffb38;
  TPZFMatrix<double> *in_stack_fffffffffffffb40;
  TPZFMatrix<double> *in_stack_fffffffffffffb48;
  TPZFNMatrix<60,_double> *in_stack_fffffffffffffb50;
  undefined4 local_41c;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 local_408;
  undefined4 local_404;
  undefined8 local_30;
  
  local_30 = 0.0;
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  bVar2 = IsZero(*pdVar3 - 1.0);
  if (bVar2) {
    pdVar3 = TPZVec<double>::operator[](in_RDI,2);
    local_30 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](in_RDI,2);
    *pdVar3 = *pdVar3 - 1e-08;
  }
  TPZFNMatrix<20,_double>::TPZFNMatrix
            ((TPZFNMatrix<20,_double> *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  TPZFNMatrix<60,_double>::TPZFNMatrix(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  TPZShapePiram::Shape
            (in_stack_000012f0,in_stack_000012e8,in_stack_000012e0,in_stack_000012d8,
             in_stack_000012d0);
  pdVar3 = TPZVec<double>::operator[](in_RDI,2);
  row = 1.0 / (1.0 - *pdVar3);
  for (local_404 = 0; local_404 < 0x13; local_404 = local_404 + 1) {
    if (local_404 != 4) {
      local_408 = 1;
      local_40c = 2;
      if (4 < local_404) {
        TPZVec<int>::operator[](in_RDX,(long)(local_404 + -5));
        local_408 = TPZShapePiram::NConnectShapeF
                              ((int)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
        TPZVec<int>::operator[](in_RDX,(long)(local_404 + -5));
        local_40c = NConnectShapeF((int)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
      }
      for (local_410 = 0; local_410 < local_408; local_410 = local_410 + 1) {
        pdVar3 = TPZFMatrix<double>::operator()
                           (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
                            CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
        dVar1 = *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()
                           (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
                            CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
        *pdVar3 = dVar1;
        for (local_414 = 0; local_414 < 3; local_414 = local_414 + 1) {
          pdVar3 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
                              CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
          dVar1 = *pdVar3;
          pdVar3 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
                              CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
          *pdVar3 = dVar1;
        }
      }
      if (local_408 << 1 == local_40c) {
        for (local_418 = 0; local_418 < local_408; local_418 = local_418 + 1) {
          pdVar3 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
                              CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
          dVar1 = *pdVar3;
          pdVar3 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
                              CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
          *pdVar3 = dVar1 * row;
          for (local_41c = 0; local_41c < 3; local_41c = local_41c + 1) {
            pdVar3 = TPZFMatrix<double>::operator()
                               (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
                                CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
            dVar1 = *pdVar3;
            pdVar3 = TPZFMatrix<double>::operator()
                               (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
                                CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
            *pdVar3 = dVar1 * row;
          }
          pdVar3 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffb40,(int64_t)in_stack_fffffffffffffb38,
                              CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
          in_stack_fffffffffffffb40 = (TPZFMatrix<double> *)(*pdVar3 * row);
          in_stack_fffffffffffffb38 = row;
          pdVar3 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffb40,(int64_t)row,
                              CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
          *pdVar3 = (double)in_stack_fffffffffffffb40 * in_stack_fffffffffffffb38 + *pdVar3;
        }
      }
    }
  }
  bVar2 = IsZero(local_30 + -1.0);
  if (bVar2) {
    pdVar3 = TPZVec<double>::operator[](in_RDI,2);
    *pdVar3 = local_30;
  }
  TPZFNMatrix<60,_double>::~TPZFNMatrix((TPZFNMatrix<60,_double> *)0x1885b6a);
  TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1885b77);
  return;
}

Assistant:

void TPZShapePiramHdiv::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
        
        REAL temp = 0.;
        if (IsZero(pt[2] - 1.)){
            temp = pt[2];
            pt[2] -= 1.e-8;
        }
        
        TPZFNMatrix<20,REAL> phicp(phi);
        TPZFNMatrix<60,REAL> dphicp(dphi);
        
        TPZShapePiram::Shape(pt, id, order, phicp, dphicp);
        
        REAL zst = 1./(1.-pt[2]);
        int count = 0;
        int countorig = 0;
        for (int is=0; is<NSides; is++) {
            if (is == 4) {
                countorig++;
                continue;
            }
            int norig = 1;
            int nshape = 2;
            if (is>4)
            {
                norig = TPZShapePiram::NConnectShapeF(is, order[is-5]);
                nshape = NConnectShapeF(is, order[is-5]);
            }
            for (int shape = 0; shape<norig; shape++)
            {
                phi(shape+count,0) = phicp(shape+countorig,0);
                for (int d=0; d<3; d++) {
                    dphi(d,shape+count) = dphicp(d,shape+countorig);
                }
            }
            if(norig*2 == nshape)
            {
                for (int shape = 0; shape<norig; shape++)
                {
                    phi(shape+norig+count,0) = phicp(shape+countorig,0)*zst;
                    for (int d=0; d<3; d++) {
                        dphi(d,shape+norig+count) = dphicp(d,shape+countorig)*zst;
                    }
                    dphi(2,shape+norig+count) += phicp(shape+countorig,0)*zst*zst;
                }
            }
            countorig+= norig;
            count += nshape;
        }
        if (IsZero(temp - 1.))
        {
            pt[2] = temp;
        }
    }